

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O1

void __thiscall
VmaDeviceMemoryBlock::Unmap(VmaDeviceMemoryBlock *this,VmaAllocator hAllocator,uint32_t count)

{
  bool bVar1;
  int iVar2;
  uint32_t uVar3;
  pthread_mutex_t *__mutex;
  
  if (count != 0) {
    bVar1 = hAllocator->m_UseMutex;
    __mutex = (pthread_mutex_t *)0x0;
    if (bVar1 != false) {
      __mutex = (pthread_mutex_t *)&this->m_MapAndBindMutex;
    }
    if (bVar1 == true) {
      iVar2 = pthread_mutex_lock(__mutex);
      if (iVar2 != 0) {
        std::__throw_system_error(iVar2);
      }
    }
    uVar3 = this->m_MapCount - count;
    if (count <= this->m_MapCount) {
      this->m_MapCount = uVar3;
      if (uVar3 + (this->m_MappingHysteresis).m_ExtraMapping == 0) {
        this->m_pMappedData = (void *)0x0;
        (*(hAllocator->m_VulkanFunctions).vkUnmapMemory)(hAllocator->m_hDevice,this->m_hMemory);
      }
      VmaMappingHysteresis::PostUnmap(&this->m_MappingHysteresis);
    }
    if (bVar1 != false) {
      pthread_mutex_unlock(__mutex);
      return;
    }
  }
  return;
}

Assistant:

void VmaDeviceMemoryBlock::Unmap(VmaAllocator hAllocator, uint32_t count)
{
    if (count == 0)
    {
        return;
    }

    VmaMutexLock lock(m_MapAndBindMutex, hAllocator->m_UseMutex);
    if (m_MapCount >= count)
    {
        m_MapCount -= count;
        const uint32_t totalMapCount = m_MapCount + m_MappingHysteresis.GetExtraMapping();
        if (totalMapCount == 0)
        {
            m_pMappedData = VMA_NULL;
            (*hAllocator->GetVulkanFunctions().vkUnmapMemory)(hAllocator->m_hDevice, m_hMemory);
        }
        m_MappingHysteresis.PostUnmap();
    }
    else
    {
        VMA_ASSERT(0 && "VkDeviceMemory block is being unmapped while it was not previously mapped.");
    }
}